

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManGlitching(Gli_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  p->vAffected->nSize = 0;
  pVVar5 = p->vCisChanged;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      Vec_IntPush(p->vAffected,pVVar5->pArray[lVar9]);
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCisChanged;
    } while (lVar9 < pVVar5->nSize);
  }
  do {
    do {
      if (p->vAffected->nSize < 1) {
        return;
      }
      p->vFrontier->nSize = 0;
      pVVar5 = p->vAffected;
      if (0 < pVVar5->nSize) {
        lVar9 = 0;
        do {
          if (p->pObjData == (int *)0x0) break;
          puVar1 = (uint *)(p->pObjData + pVVar5->pArray[lVar9]);
          uVar2 = *puVar1;
          if (0x7f < uVar2) {
            lVar8 = 0;
            do {
              lVar4 = (long)(int)puVar1[(ulong)(uVar2 >> 4 & 7) + lVar8 + 7];
              uVar2 = puVar1[lVar4];
              if ((char)((uVar2 & 8) >> 3) == '\0' && (uVar2 & 0x71) != 0x11) {
                puVar1[lVar4] = uVar2 | 8;
                Vec_IntPush(p->vFrontier,puVar1[lVar4 + 1]);
              }
              uVar2 = *puVar1;
              lVar8 = lVar8 + 1;
            } while ((uint)lVar8 < uVar2 >> 7);
          }
          lVar9 = lVar9 + 1;
          pVVar5 = p->vAffected;
        } while (lVar9 < pVVar5->nSize);
      }
      pVVar5->nSize = 0;
      pVVar5 = p->vFrontier;
    } while (pVVar5->nSize < 1);
    lVar9 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + pVVar5->pArray[lVar9]);
      uVar2 = *puVar1;
      *puVar1 = uVar2 & 0xfffffff7;
      uVar7 = uVar2 >> 4 & 7;
      if (uVar7 == 0) {
        uVar3 = 0;
      }
      else {
        uVar6 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | (puVar1[-(long)(int)puVar1[uVar6 + 7]] >> 2 & 1) << ((byte)uVar6 & 0x1f);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if (((puVar1[(long)((int)uVar3 >> 5) + 2] >> ((byte)uVar3 & 0x1f) ^ uVar2 >> 2) & 1) != 0) {
        *puVar1 = uVar2 & 0xfffffff7 ^ 4;
        puVar1[6] = puVar1[6] + 1;
        Vec_IntPush(p->vAffected,puVar1[1]);
      }
      lVar9 = lVar9 + 1;
      pVVar5 = p->vFrontier;
    } while (lVar9 < pVVar5->nSize);
  } while( true );
}

Assistant:

void Gli_ManGlitching( Gli_Man_t * p )
{
    Gli_Obj_t * pThis, * pFanout;//, * pOther = Gli_ManObj(p, 41);
    int i, k, Handle;
//    Gli_ManForEachObj( p, pThis, i )
//        assert( pThis->fMark == 0 );
    // start the array of affected nodes
    Vec_IntClear( p->vAffected );
    Vec_IntForEachEntry( p->vCisChanged, Handle, i )
        Vec_IntPush( p->vAffected, Handle );
    // iteration propagation
    while ( Vec_IntSize(p->vAffected) > 0 )
    {
        // compute the frontier
        Vec_IntClear( p->vFrontier );
        Gli_ManForEachEntry( p->vAffected, p, pThis, i )
        {
            Gli_ObjForEachFanout( pThis, pFanout, k )
            {
                if ( Gli_ObjIsCo(pFanout) )
                    continue;
                if ( pFanout->fMark )
                    continue;
                pFanout->fMark = 1;
                Vec_IntPush( p->vFrontier, pFanout->Handle );
            }
        }
        // compute the next set of affected nodes
        Vec_IntClear( p->vAffected );
        Gli_ManForEachEntry( p->vFrontier, p, pThis, i )
        {
            pThis->fMark = 0;
            if ( ((int)pThis->fPhase2) == Gli_NodeComputeValue2(pThis) )
                continue;
            pThis->fPhase2 ^= 1;
            pThis->nGlitches++;
            Vec_IntPush( p->vAffected, pThis->Handle );
        }
    }
}